

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

Duration absl::time_internal::FromInt64(long v)

{
  long lVar1;
  Duration DVar2;
  Duration DVar3;
  int64_t v_local;
  int64_t local_18;
  uint32_t local_10;
  
  lVar1 = std::numeric_limits<long>::max();
  if ((lVar1 / 0xe10 < v) || (lVar1 = std::numeric_limits<long>::min(), v < lVar1 / 0xe10)) {
    if (v < 1) {
      DVar3 = InfiniteDuration();
      DVar2._12_4_ = 0;
      DVar2.rep_hi_ = SUB128(DVar3._0_12_,0);
      DVar2.rep_lo_ = SUB124(DVar3._0_12_,8);
      DVar2 = absl::operator-(DVar2);
      local_18 = DVar2.rep_hi_;
      local_10 = DVar2.rep_lo_;
    }
    else {
      DVar2 = InfiniteDuration();
      local_18 = DVar2.rep_hi_;
      local_10 = DVar2.rep_lo_;
    }
  }
  else {
    DVar2 = MakeDuration(v * 0xe10,0);
    local_18 = DVar2.rep_hi_;
    local_10 = DVar2.rep_lo_;
  }
  DVar3.rep_lo_ = local_10;
  DVar3.rep_hi_ = local_18;
  DVar3._12_4_ = 0;
  return DVar3;
}

Assistant:

constexpr Duration FromInt64(int64_t v, std::ratio<3600>) {
  return (v <= (std::numeric_limits<int64_t>::max)() / 3600 &&
          v >= (std::numeric_limits<int64_t>::min)() / 3600)
             ? MakeDuration(v * 3600)
             : v > 0 ? InfiniteDuration() : -InfiniteDuration();
}